

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O2

void picojson::serialize_str<std::back_insert_iterator<std::__cxx11::string>>
               (string *s,
               back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               oi)

{
  byte bVar1;
  byte *pbVar2;
  byte *__value;
  undefined1 local_58 [8];
  char buf [7];
  allocator local_31;
  
  std::__cxx11::string::push_back((char)oi.container);
  pbVar2 = (byte *)(s->_M_dataplus)._M_p;
  __value = pbVar2;
  do {
    if (__value == pbVar2 + s->_M_string_length) {
      std::__cxx11::string::push_back((char)oi.container);
      return;
    }
    bVar1 = *__value;
    switch(bVar1) {
    case 8:
      std::__cxx11::string::string((string *)local_58,"\\b",&local_31);
      copy<std::back_insert_iterator<std::__cxx11::string>>((string *)local_58,oi);
      break;
    case 9:
      std::__cxx11::string::string((string *)local_58,"\\t",&local_31);
      copy<std::back_insert_iterator<std::__cxx11::string>>((string *)local_58,oi);
      break;
    case 10:
      std::__cxx11::string::string((string *)local_58,"\\n",&local_31);
      copy<std::back_insert_iterator<std::__cxx11::string>>((string *)local_58,oi);
      break;
    case 0xb:
switchD_00119553_caseD_b:
      if (bVar1 < 0x20 || bVar1 == 0x7f) {
        snprintf((char *)local_58,7,"\\u%04x");
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<char*,std::back_insert_iterator<std::__cxx11::string>>
                  ((char *)local_58,local_58 + 6,oi);
      }
      else {
        local_58 = (undefined1  [8])oi.container;
        std::
        back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator=((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_58,(value_type *)__value);
      }
      goto LAB_001196b7;
    case 0xc:
      std::__cxx11::string::string((string *)local_58,"\\f",&local_31);
      copy<std::back_insert_iterator<std::__cxx11::string>>((string *)local_58,oi);
      break;
    case 0xd:
      std::__cxx11::string::string((string *)local_58,"\\r",&local_31);
      copy<std::back_insert_iterator<std::__cxx11::string>>((string *)local_58,oi);
      break;
    default:
      if (bVar1 == 0x5c) {
        std::__cxx11::string::string((string *)local_58,"\\\\",&local_31);
        copy<std::back_insert_iterator<std::__cxx11::string>>((string *)local_58,oi);
      }
      else if (bVar1 == 0x2f) {
        std::__cxx11::string::string((string *)local_58,"\\/",&local_31);
        copy<std::back_insert_iterator<std::__cxx11::string>>((string *)local_58,oi);
      }
      else {
        if (bVar1 != 0x22) goto switchD_00119553_caseD_b;
        std::__cxx11::string::string((string *)local_58,"\\\"",&local_31);
        copy<std::back_insert_iterator<std::__cxx11::string>>((string *)local_58,oi);
      }
    }
    std::__cxx11::string::~string((string *)local_58);
LAB_001196b7:
    __value = __value + 1;
    pbVar2 = (byte *)(s->_M_dataplus)._M_p;
  } while( true );
}

Assistant:

void serialize_str(const std::string& s, Iter oi) {
    *oi++ = '"';
    for (std::string::const_iterator i = s.begin(); i != s.end(); ++i) {
      switch (*i) {
#define MAP(val, sym) case val: copy(sym, oi); break
    MAP('"', "\\\"");
    MAP('\\', "\\\\");
    MAP('/', "\\/");
    MAP('\b', "\\b");
    MAP('\f', "\\f");
    MAP('\n', "\\n");
    MAP('\r', "\\r");
    MAP('\t', "\\t");
#undef MAP
      default:
    if (static_cast<unsigned char>(*i) < 0x20 || *i == 0x7f) {
      char buf[7];
      SNPRINTF(buf, sizeof(buf), "\\u%04x", *i & 0xff);
      copy(buf, buf + 6, oi);
      } else {
      *oi++ = *i;
    }
    break;
      }
    }
    *oi++ = '"';
  }